

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O3

void __thiscall
gl4cts::TextureViewTestViewClasses::verifyResultData
          (TextureViewTestViewClasses *this,GLenum texture_internalformat,GLenum view_internalformat
          ,uchar *texture_data_ptr,uchar *view_data_ptr)

{
  ostringstream *poVar1;
  qpTestLog *pqVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint n_component;
  int iVar6;
  uint uVar7;
  _format _Var8;
  undefined4 uVar9;
  deUint32 dVar10;
  _sampler_type _Var11;
  Float<unsigned_int,_8,_23,_127,_3U> FVar12;
  char *pcVar13;
  char *pcVar14;
  undefined4 extraout_var;
  uchar *puVar15;
  ulong uVar16;
  long lVar17;
  size_t sVar18;
  TestError *this_00;
  sbyte sVar19;
  GLuint *pGVar20;
  long lVar21;
  GLenum GVar22;
  undefined8 uVar23;
  ulong uVar24;
  TextureViewTestViewClasses *pTVar25;
  ios_base *this_01;
  undefined1 *result;
  uint uVar26;
  uint *data;
  uchar **ppuVar27;
  uchar *puVar28;
  uint uVar29;
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  uint reference_components_uint [4];
  int reference_components_int [4];
  uint view_components_uint [4];
  int view_components_int [4];
  float view_components_float [4];
  stringstream mipmap_data_sstream;
  uint view_component_sizes [4];
  undefined1 auStack_598 [4];
  GLenum local_594;
  TextureViewTestViewClasses *local_590;
  ulong local_588;
  uint local_580;
  uint local_57c;
  char *local_578;
  char *local_570;
  uchar *local_568;
  ulong local_560;
  undefined1 local_558 [16];
  long local_548 [3];
  uint local_530;
  _format local_52c;
  undefined1 local_528 [16];
  long local_518 [2];
  undefined1 local_508 [16];
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [8];
  float fStack_4e0;
  float fStack_4dc;
  uchar *local_4d8;
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [104];
  ios_base local_458 [8];
  ios_base aiStack_450 [96];
  char acStack_3f0 [168];
  undefined8 local_348;
  undefined8 uStack_340;
  undefined1 local_338 [112];
  ios_base aiStack_2c8 [96];
  char acStack_268 [176];
  undefined1 local_1b8 [8];
  Float<unsigned_int,_8,_23,_127,_3U> FStack_1b0;
  float fStack_1ac;
  ios_base local_140 [272];
  
  pcVar13 = TextureViewUtilities::getInternalformatString(texture_internalformat);
  pcVar14 = TextureViewUtilities::getInternalformatString(view_internalformat);
  local_4d8 = view_data_ptr;
  iVar6 = bcmp(texture_data_ptr,view_data_ptr,(ulong)this->m_view_data_offset);
  if (iVar6 != 0) {
    local_578 = pcVar14;
    iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    local_568 = (uchar *)CONCAT44(extraout_var,iVar6);
    bVar5 = TextureViewUtilities::isInternalformatCompressed(view_internalformat);
    uVar7 = TextureViewUtilities::getAmountOfComponentsForInternalformat(view_internalformat);
    _Var8 = TextureViewUtilities::getFormatOfInternalformat(texture_internalformat);
    local_588 = CONCAT44(local_588._4_4_,_Var8);
    local_348 = 0;
    uStack_340 = 0;
    local_52c = TextureViewUtilities::getFormatOfInternalformat(view_internalformat);
    puVar28 = local_568;
    local_594 = texture_internalformat;
    local_590 = this;
    local_580 = uVar7;
    local_570 = pcVar13;
    if (bVar5) {
      lVar21 = (ulong)uVar7 - 1;
      auVar31._8_4_ = (int)lVar21;
      auVar31._0_8_ = lVar21;
      auVar31._12_4_ = (int)((ulong)lVar21 >> 0x20);
      if ((texture_internalformat & 0xfffffffe) == 0x8e8e) {
        local_348 = CONCAT44(local_348._4_4_,0x20);
        auVar31 = auVar31 ^ _DAT_019ec5b0;
        if (auVar31._12_4_ != -0x80000000 || -0x80000000 < auVar31._8_4_) {
          local_348 = 0x2000000020;
        }
        bVar3 = auVar31._0_4_ < -0x7ffffffe;
        bVar5 = auVar31._4_4_ == -0x80000000;
        bVar4 = bVar5 && bVar3;
        if (!bVar5 || !bVar3) {
          uStack_340 = CONCAT44(uStack_340._4_4_,0x20);
        }
        sVar19 = 5;
        uVar9 = 0x20;
      }
      else {
        local_348 = CONCAT44(local_348._4_4_,8);
        auVar31 = auVar31 ^ _DAT_019ec5b0;
        if (auVar31._12_4_ != -0x80000000 || -0x80000000 < auVar31._8_4_) {
          local_348 = 0x800000008;
        }
        bVar3 = auVar31._0_4_ < -0x7ffffffe;
        bVar5 = auVar31._4_4_ == -0x80000000;
        bVar4 = bVar5 && bVar3;
        if (!bVar5 || !bVar3) {
          uStack_340 = CONCAT44(uStack_340._4_4_,8);
        }
        sVar19 = 3;
        uVar9 = 8;
      }
      if (!bVar4) {
        uStack_340 = CONCAT44(uVar9,(int)uStack_340);
      }
      ppuVar27 = &this->m_decompressed_mipmap_data;
      if (this->m_decompressed_mipmap_data != (uchar *)0x0) {
        operator_delete__(this->m_decompressed_mipmap_data);
        *ppuVar27 = (uchar *)0x0;
      }
      pTVar25 = local_590;
      local_57c = uVar7 << sVar19;
      puVar15 = (uchar *)operator_new__((ulong)(((uVar7 << sVar19) >> 3) *
                                                local_590->m_texture_width *
                                               local_590->m_texture_height));
      pTVar25->m_decompressed_mipmap_data = puVar15;
      pGVar20 = &pTVar25->m_to_id;
      if ((texture_internalformat & 0xfffffffe) == 0x8e8e) {
        pGVar20 = &pTVar25->m_view_to_id;
      }
      (**(code **)(puVar28 + 0xb8))(0xde1,*pGVar20);
      dVar10 = (**(code **)(puVar28 + 0x800))();
      glu::checkError(dVar10,"glBindTexture() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x1d93);
      uVar26 = local_580;
      if (local_580 == 3) {
        uVar23 = 0x1907;
      }
      else {
        uVar23 = 0x1908;
        if ((local_580 != 4) && (uVar23 = 0x1903, local_580 == 2)) {
          uVar23 = 0x8227;
        }
      }
      lVar21 = 0x1400;
      if ((int)local_588 != 3) {
        lVar21 = (ulong)((int)local_588 == 0) * 5 + 0x1401;
      }
      (**(code **)(puVar28 + 0xaa0))(0xde1,0,uVar23,lVar21,*ppuVar27);
      dVar10 = (**(code **)(puVar28 + 0x800))();
      glu::checkError(dVar10,"glGetTexImage() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x1d9e);
      this = local_590;
      uVar29 = local_57c;
    }
    else {
      TextureViewUtilities::getComponentSizeForInternalformat
                (view_internalformat,(uint *)&local_348);
      uVar29 = uStack_340._4_4_ + local_348._4_4_ + (int)uStack_340 + (uint)local_348;
      ppuVar27 = &this->m_mipmap_data;
      uVar26 = local_580;
    }
    pcVar14 = local_578;
    pcVar13 = local_570;
    if (this->m_texture_width * this->m_texture_height != 0) {
      local_568 = *ppuVar27;
      local_57c = uVar29 >> 3;
      local_588 = (ulong)(uVar26 << 2);
      uVar16 = 0;
      bVar3 = false;
      bVar5 = false;
      puVar28 = local_4d8;
      do {
        uVar26 = local_57c * (int)uVar16;
        _local_1b8 = (undefined1  [16])0x0;
        local_528 = (undefined1  [16])0x0;
        local_558 = (undefined1  [16])0x0;
        _local_4e8 = (undefined1  [16])0x0;
        local_4f8 = (undefined1  [16])0x0;
        local_508 = (undefined1  [16])0x0;
        pTVar25 = (TextureViewTestViewClasses *)(ulong)view_internalformat;
        local_560 = uVar16;
        _Var11 = TextureViewUtilities::getSamplerTypeForInternalformat(view_internalformat);
        uVar16 = 0;
        do {
          if (_Var11 == SAMPLER_TYPE_SIGNED_INTEGER) {
            *(undefined4 *)(local_4f8 + uVar16 * 4) = *(undefined4 *)(puVar28 + uVar16 * 4);
          }
          else if (_Var11 == SAMPLER_TYPE_FLOAT) {
            *(undefined4 *)(local_4e8 + uVar16 * 4) = *(undefined4 *)(puVar28 + uVar16 * 4);
          }
          else {
            *(undefined4 *)(local_508 + uVar16 * 4) = *(undefined4 *)(puVar28 + uVar16 * 4);
          }
          uVar16 = uVar16 + 1;
        } while (uVar7 != uVar16);
        data = (uint *)(local_568 + uVar26);
        if ((int)view_internalformat < 0x8c3a) {
          if (view_internalformat == 0x8059) {
            if (_Var11 != SAMPLER_TYPE_FLOAT) {
              this_00 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_00,"Internal error: invalid sampler type requested",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                         ,0x1e15);
              goto LAB_00a2e016;
            }
            uVar26 = *data;
            auVar32._0_4_ = (float)(uVar26 & 0x3ff);
            auVar32._4_4_ = (float)(uVar26 >> 10 & 0x3ff);
            auVar32._8_4_ = (float)(uVar26 >> 0x14 & 0x3ff);
            auVar32._12_4_ = (float)(uVar26 >> 0x1e);
            _local_1b8 = divps(auVar32,_DAT_01a9ac20);
          }
          else if (view_internalformat == 0x822f) {
            if (_Var11 != SAMPLER_TYPE_FLOAT) {
              this_00 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_00,"Internal error: invalid sampler type requested",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                         ,0x1e35);
              goto LAB_00a2e016;
            }
            local_4d0._0_2_ = (StorageType_conflict)*data;
            FVar12 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                               ((Float<unsigned_short,_5,_10,_15,_3U> *)local_4d0);
            local_1b8._0_4_ = FVar12.m_value;
            local_4d0._0_2_ = *(undefined2 *)((long)data + 2);
            FVar12 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                               ((Float<unsigned_short,_5,_10,_15,_3U> *)local_4d0);
            local_1b8._4_4_ = FVar12.m_value;
          }
          else {
LAB_00a2d124:
            result = local_1b8;
            if (_Var11 != SAMPLER_TYPE_FLOAT) {
              if (_Var11 == SAMPLER_TYPE_UNSIGNED_INTEGER) {
                result = local_558;
              }
              else {
                result = local_528;
              }
            }
            getComponentDataForByteAlignedInternalformat
                      (pTVar25,(uchar *)data,local_580,(uint *)&local_348,local_52c,result);
          }
        }
        else if (view_internalformat == 0x8c3a) {
          if (_Var11 != SAMPLER_TYPE_FLOAT) {
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,"Internal error: invalid sampler type requested",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                       ,0x1dec);
LAB_00a2e016:
            __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          uVar26 = *data;
          local_530 = uVar26 >> 0x16;
          local_4d0._0_8_ = CONCAT44(local_4d0._4_4_,uVar26) & 0xffffffff000007ff;
          FVar12 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_int,5,6,15,0u>
                             ((Float<unsigned_int,_5,_6,_15,_0U> *)local_4d0);
          local_1b8._0_4_ = FVar12.m_value;
          local_4d0._0_8_ = CONCAT44(local_4d0._4_4_,uVar26 >> 0xb) & 0xffffffff000007ff;
          FVar12 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_int,5,6,15,0u>
                             ((Float<unsigned_int,_5,_6,_15,_0U> *)local_4d0);
          local_1b8._4_4_ = FVar12.m_value;
          local_4d0._0_4_ = local_530;
          FVar12 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_int,5,5,15,0u>
                             ((Float<unsigned_int,_5,_5,_15,_0U> *)local_4d0);
          FStack_1b0.m_value = FVar12.m_value;
        }
        else {
          pTVar25 = (TextureViewTestViewClasses *)&DAT_00000001;
          if (view_internalformat == 0x8c3d) {
            uVar26 = *data;
            fVar30 = ldexpf(1.0,(uVar26 >> 0x1b) - 0x18);
            auVar31 = _local_1b8;
            if (_Var11 != SAMPLER_TYPE_FLOAT) {
              this_00 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_00,"Internal error: invalid sampler type requested",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                         ,0x1e03);
              goto LAB_00a2e016;
            }
            local_1b8._4_4_ = (float)(uVar26 >> 9 & 0x1ff) * fVar30;
            local_1b8._0_4_ = (float)(uVar26 & 0x1ff) * fVar30;
            fStack_1ac = auVar31._12_4_;
            FStack_1b0.m_value = (StorageType)((float)(uVar26 >> 0x12 & 0x1ff) * fVar30);
          }
          else {
            if (view_internalformat != 0x906f) goto LAB_00a2d124;
            if (_Var11 != SAMPLER_TYPE_UNSIGNED_INTEGER) {
              this_00 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_00,"Internal error: invalid sampler type requested",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                         ,0x1e27);
              goto LAB_00a2e016;
            }
            uVar26 = *data;
            local_558._0_8_ = CONCAT44(uVar26 >> 10,uVar26) & 0x3ff000003ff;
            local_558._8_4_ = uVar26 >> 0x14 & 0x3ff;
            local_558._12_4_ = uVar26 >> 0x1e;
          }
        }
        uVar16 = 0;
        uVar24 = local_588;
        GVar22 = local_594;
        do {
          if ((((view_internalformat == 0x8c41) || (view_internalformat == 0x8e8d)) ||
              (view_internalformat == 0x8c43)) &&
             (((uVar16 != 0xc && (GVar22 != 0x8c41)) && ((GVar22 != 0x8c43 && (GVar22 != 0x8e8d)))))
             ) {
            fVar30 = *(float *)(local_1b8 + uVar16);
            if (fVar30 <= 0.04045) {
              fVar30 = fVar30 / 12.92;
            }
            else {
              fVar30 = powf((fVar30 + 0.055) / 1.055,2.4);
              uVar24 = local_588;
              GVar22 = local_594;
            }
            *(float *)(local_1b8 + uVar16) = fVar30;
          }
          pcVar14 = local_570;
          this = local_590;
          if (_Var11 != SAMPLER_TYPE_UNSIGNED_INTEGER) {
            if (_Var11 == SAMPLER_TYPE_SIGNED_INTEGER) {
              lVar17 = (long)*(int *)(local_528 + uVar16) - (long)*(int *)(local_4f8 + uVar16);
              lVar21 = -lVar17;
              if (0 < lVar17) {
                lVar21 = lVar17;
              }
              bVar5 = bVar3;
              if (1 < (int)lVar21) {
                bVar5 = true;
                bVar3 = true;
              }
              goto LAB_00a2d2c0;
            }
            fVar30 = *(float *)(local_1b8 + uVar16) - *(float *)(local_4e8 + uVar16);
            auVar33._0_4_ = -fVar30;
            auVar33._4_4_ = 0x80000000;
            auVar33._8_4_ = 0x80000000;
            auVar33._12_4_ = 0x80000000;
            if (auVar33._0_4_ <= fVar30) {
              auVar33._0_4_ = fVar30;
            }
            if (auVar33._0_4_ <=
                1.0 / (float)~(-1 << (*(char *)((long)&local_348 + uVar16) - 1U & 0x1f)))
            goto LAB_00a2d2c0;
            bVar5 = true;
LAB_00a2d779:
            local_4d0._0_8_ =
                 ((local_590->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            poVar1 = (ostringstream *)(local_4d0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"Invalid data sampled from a texture view [",0x2a);
            pcVar13 = local_578;
            sVar18 = strlen(local_578);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar13,sVar18);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"] created from a texture object[",0x20);
            sVar18 = strlen(pcVar14);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar14,sVar18);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] at texel (",0xc)
            ;
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"): expected:(",0xd);
            std::ostream::_M_insert<double>((double)(float)local_1b8._0_4_);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::_M_insert<double>((double)(float)local_1b8._4_4_);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::_M_insert<double>((double)(float)FStack_1b0.m_value);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::_M_insert<double>((double)fStack_1ac);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") found:(",9);
            std::ostream::_M_insert<double>((double)(float)local_4e8._0_4_);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::_M_insert<double>((double)(float)local_4e8._4_4_);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::_M_insert<double>((double)fStack_4e0);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::_M_insert<double>((double)fStack_4dc);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,").",2);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_4d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00a2d9ae:
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_4d0 + 8));
            std::ios_base::~ios_base((ios_base *)(local_4c0 + 0x68));
            goto LAB_00a2d9ca;
          }
          lVar17 = (ulong)*(uint *)(local_558 + uVar16) - (ulong)*(uint *)(local_508 + uVar16);
          lVar21 = -lVar17;
          if (0 < lVar17) {
            lVar21 = lVar17;
          }
          bVar5 = bVar3;
          if (1 < (uint)lVar21) {
            bVar5 = true;
            bVar3 = bVar5;
          }
LAB_00a2d2c0:
          if (bVar5) {
            if (_Var11 == SAMPLER_TYPE_UNSIGNED_INTEGER) {
              local_4d0._0_8_ =
                   ((local_590->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              poVar1 = (ostringstream *)(local_4d0 + 8);
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,
                         "Invalid data sampled from an unsigned integer texture view [",0x3c);
              pcVar13 = local_570;
              pcVar14 = local_578;
              sVar18 = strlen(local_578);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar14,sVar18);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"] created from a texture object[",0x20);
              sVar18 = strlen(pcVar13);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar13,sVar18);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"] at texel (",0xc);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"): expected:(",0xd);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") found:(",9);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,").",2);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_4d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            }
            else {
              if (_Var11 != SAMPLER_TYPE_SIGNED_INTEGER) goto LAB_00a2d779;
              local_4d0._0_8_ =
                   ((local_590->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              poVar1 = (ostringstream *)(local_4d0 + 8);
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,
                         "Invalid data sampled from a signed integer texture view [",0x39);
              pcVar13 = local_578;
              sVar18 = strlen(local_578);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar13,sVar18);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"] created from a texture object[",0x20);
              sVar18 = strlen(pcVar14);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar14,sVar18);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"] at texel (",0xc);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"): expected:(",0xd);
              std::ostream::operator<<(poVar1,local_528._0_4_);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
              std::ostream::operator<<(poVar1,local_528._4_4_);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
              std::ostream::operator<<(poVar1,local_528._8_4_);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
              std::ostream::operator<<(poVar1,local_528._12_4_);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") found:(",9);
              std::ostream::operator<<(poVar1,local_4f8._0_4_);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
              std::ostream::operator<<(poVar1,local_4f8._4_4_);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
              std::ostream::operator<<(poVar1,local_4f8._8_4_);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
              std::ostream::operator<<(poVar1,local_4f8._12_4_);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,").",2);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_4d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            }
            goto LAB_00a2d9ae;
          }
          uVar16 = uVar16 + 4;
        } while (uVar24 != uVar16);
        uVar16 = local_560 + 1;
        puVar28 = puVar28 + uVar24;
      } while (uVar16 < local_590->m_texture_width * local_590->m_texture_height);
LAB_00a2d9ca:
      pcVar13 = local_570;
      pcVar14 = local_578;
      if (bVar5) {
        local_4d0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_4d0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Invalid data read from a view of internalformat ",0x30);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[",1);
        sVar18 = strlen(pcVar14);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar14,sVar18);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," created from a texture of internalformat ",0x2a);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[",1);
        sVar18 = strlen(pcVar13);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar13,sVar18);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,". Byte streams follow:",0x16);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_4d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_4c0 + 0x68));
        std::__cxx11::stringstream::stringstream((stringstream *)local_4d0);
        std::__cxx11::stringstream::stringstream((stringstream *)&local_348);
        pqVar2 = ((TestLog *)(local_4d0._0_8_ + -0x18))->m_log;
        if ((acStack_3f0 + 1)[(long)pqVar2] == '\0') {
          std::ios::widen((char)auStack_598 + (char)pqVar2 + -0x38);
          (acStack_3f0 + 1)[(long)pqVar2] = '\x01';
        }
        acStack_3f0[(long)pqVar2] = '0';
        lVar21 = *(long *)(local_348 + -0x18);
        if (acStack_268[lVar21 + 1] == '\0') {
          std::ios::widen((char)auStack_598 + (char)lVar21 + 'P');
          acStack_268[lVar21 + 1] = '\x01';
        }
        lVar17 = local_348;
        acStack_268[lVar21] = '0';
        *(undefined8 *)(local_4c0 + (long)((TestLog *)(local_4d0._0_8_ + -0x18))->m_log) = 2;
        *(undefined8 *)(local_338 + *(long *)(lVar17 + -0x18)) = 2;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4c0,"Mip-map data: [",0xf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_338,"Sampled view data: [",0x14);
        if (local_590->m_view_data_offset != 0) {
          uVar16 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"0x",2);
            *(uint *)(*(_func_int **)(local_4c0._0_8_ + -0x18) + (long)(local_4c0 + 0x18)) =
                 *(uint *)(*(_func_int **)(local_4c0._0_8_ + -0x18) + (long)(local_4c0 + 0x18)) &
                 0xffffffb5 | 8;
            std::ostream::operator<<((ostream *)local_4c0,(uint)local_568[uVar16]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_338,"0x",2);
            *(uint *)(*(_func_int **)(local_338._0_8_ + -0x18) + (long)(local_338 + 0x18)) =
                 *(uint *)(*(_func_int **)(local_338._0_8_ + -0x18) + (long)(local_338 + 0x18)) &
                 0xffffffb5 | 8;
            std::ostream::operator<<((ostream *)local_338,(uint)local_4d8[uVar16]);
            if (uVar16 == local_590->m_view_data_offset - 1) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"]",1);
              pcVar14 = "]";
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"|",1);
              pcVar14 = "|";
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_338,pcVar14,1);
            uVar16 = uVar16 + 1;
          } while (uVar16 < local_590->m_view_data_offset);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_338,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"\n",1);
        pTVar25 = local_590;
        poVar1 = (ostringstream *)(local_1b8 + 8);
        local_1b8 = (undefined1  [8])
                    ((local_590->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__cxx11::stringbuf::str();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(char *)local_528._0_8_,local_528._8_8_);
        std::__cxx11::stringbuf::str();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(char *)local_558._0_8_,local_558._8_8_);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if ((long *)local_558._0_8_ != local_548) {
          operator_delete((void *)local_558._0_8_,local_548[0] + 1);
        }
        if ((long *)local_528._0_8_ != local_518) {
          operator_delete((void *)local_528._0_8_,local_518[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_140);
        pTVar25->m_has_test_failed = true;
        std::__cxx11::stringstream::~stringstream((stringstream *)&local_348);
        std::ios_base::~ios_base((ios_base *)(local_338 + 0x70));
        std::__cxx11::stringstream::~stringstream((stringstream *)local_4d0);
        this_01 = aiStack_450;
        goto LAB_00a2df1a;
      }
    }
  }
  local_4d0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_4d0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Correct data read from a view of internalformat ",0x30);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[",1);
  sVar18 = strlen(pcVar14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar14,sVar18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1," created from a texture of internalformat ",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[",1);
  sVar18 = strlen(pcVar13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar13,sVar18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_4d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  this_01 = (ios_base *)(local_4c0 + 0x68);
LAB_00a2df1a:
  std::ios_base::~ios_base(this_01);
  return;
}

Assistant:

void TextureViewTestViewClasses::verifyResultData(glw::GLenum texture_internalformat, glw::GLenum view_internalformat,
												  const unsigned char* texture_data_ptr,
												  const unsigned char* view_data_ptr)
{
	const char* texture_internalformat_string = TextureViewUtilities::getInternalformatString(texture_internalformat);
	const char* view_internalformat_string	= TextureViewUtilities::getInternalformatString(view_internalformat);

	/* For quite a number of cases, we can do a plain memcmp() applied to sampled texture/view data.
	 * If both buffers are a match, we're OK.
	 */
	bool				 has_failed  = false;
	const unsigned char* mipmap_data = DE_NULL;

	if (memcmp(texture_data_ptr, view_data_ptr, m_view_data_offset) != 0)
	{
		/* Iterate over all texel components.
		 *
		 * The approach we're taking here works as follows:
		 *
		 * 1) Calculate what values should be sampled for each component using input mipmap
		 *    data.
		 * 2) Compare the reference values against the values returned when sampling the view.
		 *
		 * Note that in step 2) we're dealing with data that is returned by float/int/uint samplers,
		 * so we need to additionally process the data that we obtain by "casting" input data to
		 * the view's internalformat before we can perform the comparison.
		 *
		 * Finally, if the reference values are calculated for compressed data, we decompress it
		 * to GL_R8/GL_RG8/GL_RGB8/GL_RGBA8 internalformat first, depending on how many components
		 * the compressed internalformat supports.
		 **/
		bool				  can_continue = true;
		const glw::Functions& gl		   = m_context.getRenderContext().getFunctions();

		/* Determine a few important properties first */
		const bool is_view_internalformat_compressed =
			TextureViewUtilities::isInternalformatCompressed(view_internalformat);
		unsigned int n_bits_per_view_texel = 0;

		const unsigned int n_view_components =
			TextureViewUtilities::getAmountOfComponentsForInternalformat(view_internalformat);
		_format texture_format = TextureViewUtilities::getFormatOfInternalformat(texture_internalformat);

		unsigned int view_component_sizes[4] = { 0 };
		_format		 view_format			 = TextureViewUtilities::getFormatOfInternalformat(view_internalformat);

		if (!is_view_internalformat_compressed)
		{
			TextureViewUtilities::getComponentSizeForInternalformat(view_internalformat, view_component_sizes);

			n_bits_per_view_texel =
				view_component_sizes[0] + view_component_sizes[1] + view_component_sizes[2] + view_component_sizes[3];
		}
		else
		{
			if (texture_internalformat == GL_COMPRESSED_RGB_BPTC_SIGNED_FLOAT ||
				texture_internalformat == GL_COMPRESSED_RGB_BPTC_UNSIGNED_FLOAT)
			{
				/* Each component of decompressed data will be retrieved as a 32-bit FP */
				for (unsigned int n_component = 0; n_component < n_view_components; ++n_component)
				{
					view_component_sizes[n_component] = 32 /* bits per byte */;
				}

				n_bits_per_view_texel = 32 /* bits per byte */ * n_view_components;
			}
			else
			{
				/* Each component of decompressed data is stored as either signed or unsigned
				 * byte. */
				for (unsigned int n_component = 0; n_component < n_view_components; ++n_component)
				{
					view_component_sizes[n_component] = 8 /* bits per byte */;
				}

				n_bits_per_view_texel = 8 /* bits per byte */ * n_view_components;
			}
		}

		/* If we need to use compressed data as reference, we need to ask GL to decompress
		 * the mipmap data using view-specific internalformat.
		 */
		mipmap_data = m_mipmap_data;

		if (is_view_internalformat_compressed)
		{
			/* Deallocate the buffer if necessary just in case */
			if (m_decompressed_mipmap_data != DE_NULL)
			{
				delete[] m_decompressed_mipmap_data;

				m_decompressed_mipmap_data = DE_NULL;
			}

			m_decompressed_mipmap_data =
				new unsigned char[m_texture_width * m_texture_height * (n_bits_per_view_texel >> 3)];

			glw::GLuint reference_tex_id = m_to_id;
			if (texture_internalformat == GL_COMPRESSED_RGB_BPTC_SIGNED_FLOAT ||
				texture_internalformat == GL_COMPRESSED_RGB_BPTC_UNSIGNED_FLOAT)
			{
				// Encodings of SIGNED and UNSIGNED BPTC compressed texture are not compatible
				// even though they are in the same view class. Since the "view" texture contains
				// the correct encoding for the results we use that as a reference instead of the
				// incompatible parent encoded.
				reference_tex_id = m_view_to_id;
			}
			gl.bindTexture(GL_TEXTURE_2D, reference_tex_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

			gl.getTexImage(GL_TEXTURE_2D, 0, /* level */
						   (n_view_components == 4) ?
							   GL_RGBA :
							   (n_view_components == 3) ? GL_RGB : (n_view_components == 2) ? GL_RG : GL_RED,
						   (texture_format == FORMAT_SNORM) ?
							   GL_BYTE :
							   (texture_format == FORMAT_FLOAT) ? GL_FLOAT : GL_UNSIGNED_BYTE,
						   m_decompressed_mipmap_data);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexImage() call failed.");

			mipmap_data = m_decompressed_mipmap_data;
		}

		for (unsigned int n_texel = 0; n_texel < m_texture_height * m_texture_width && can_continue; ++n_texel)
		{
			/* NOTE: Vertex shader stores the sampled contents of a view texture as a
			 *       vec4/ivec4/uvec4. This means that each comonent in view_data_ptr
			 *       always takes sizeof(float) = sizeof(int) = sizeof(uint) bytes.
			 *
			 * NOTE: We cast input mip-map's data to view's internalformat, which is
			 *       why we're assuming each components takes n_bits_per_view_texel
			 *       bits instead of n_bits_per_mipmap_texel.
			 */
			const unsigned char* mipmap_texel_data =
				mipmap_data + (n_bits_per_view_texel >> 3 /* 8 bits/byte */) * n_texel;
			float		  reference_components_float[4] = { 0 };
			signed int	reference_components_int[4]   = { 0 };
			unsigned int  reference_components_uint[4]  = { 0 };
			float		  view_components_float[4]		= { 0 };
			signed int	view_components_int[4]		= { 0 };
			unsigned int  view_components_uint[4]		= { 0 };
			_sampler_type view_sampler_type =
				TextureViewUtilities::getSamplerTypeForInternalformat(view_internalformat);
			const unsigned char* view_texel_data = view_data_ptr + sizeof(float) * n_view_components * n_texel;

			/* Retrieve data sampled from the view */
			for (unsigned int n_component = 0; n_component < n_view_components;
				 view_texel_data += sizeof(float), /* as per comment */
				 ++n_component)
			{
				switch (view_sampler_type)
				{
				case SAMPLER_TYPE_FLOAT:
				{
					view_components_float[n_component] = *((float*)view_texel_data);

					break;
				}

				case SAMPLER_TYPE_SIGNED_INTEGER:
				{
					view_components_int[n_component] = *((signed int*)view_texel_data);

					break;
				}

				case SAMPLER_TYPE_UNSIGNED_INTEGER:
				{
					view_components_uint[n_component] = *((unsigned int*)view_texel_data);

					break;
				}

				default:
				{
					TCU_FAIL("Unrecognized sampler type");
				}
				} /* switch (view_sampler_type) */
			}	 /* for (all components) */

			/* Compute reference data. Handle non-byte aligned internalformats manually. */
			if (view_internalformat == GL_R11F_G11F_B10F)
			{
				const unsigned int* reference_data  = (unsigned int*)mipmap_texel_data;
				const unsigned int  red_component   = (*reference_data) & ((1 << 11) - 1);
				const unsigned int  green_component = (*reference_data >> 11) & ((1 << 11) - 1);
				const unsigned int  blue_component  = (*reference_data >> 22) & ((1 << 10) - 1);

				if (view_sampler_type == SAMPLER_TYPE_FLOAT)
				{
					reference_components_float[0] = Float11(red_component).asFloat();
					reference_components_float[1] = Float11(green_component).asFloat();
					reference_components_float[2] = Float10(blue_component).asFloat();
				}
				else
				{
					TCU_FAIL("Internal error: invalid sampler type requested");
				}
			}
			else if (view_internalformat == GL_RGB9_E5)
			{
				/* Refactored version of tcuTexture.cpp::unpackRGB999E5() */
				const unsigned int* reference_data  = (unsigned int*)mipmap_texel_data;
				const unsigned int  exponent		= (*reference_data >> 27) & ((1 << 5) - 1);
				const unsigned int  red_component   = (*reference_data) & ((1 << 9) - 1);
				const unsigned int  green_component = (*reference_data >> 9) & ((1 << 9) - 1);
				const unsigned int  blue_component  = (*reference_data >> 18) & ((1 << 9) - 1);

				float shared_exponent =
					deFloatPow(2.0f, (float)((int)exponent - 15 /* exponent bias */ - 9 /* mantissa */));

				if (view_sampler_type == SAMPLER_TYPE_FLOAT)
				{
					reference_components_float[0] = float(red_component) * shared_exponent;
					reference_components_float[1] = float(green_component) * shared_exponent;
					reference_components_float[2] = float(blue_component) * shared_exponent;
				}
				else
				{
					TCU_FAIL("Internal error: invalid sampler type requested");
				}
			}
			else if (view_internalformat == GL_RGB10_A2)
			{
				unsigned int*	  reference_data = (unsigned int*)mipmap_texel_data;
				const unsigned int mask_rgb		  = (1 << 10) - 1;
				const unsigned int mask_a		  = (1 << 2) - 1;

				if (view_sampler_type == SAMPLER_TYPE_FLOAT)
				{
					reference_components_float[0] = float(((*reference_data)) & (mask_rgb)) / float(mask_rgb);
					reference_components_float[1] = float(((*reference_data) >> 10) & (mask_rgb)) / float(mask_rgb);
					reference_components_float[2] = float(((*reference_data) >> 20) & (mask_rgb)) / float(mask_rgb);
					reference_components_float[3] = float(((*reference_data) >> 30) & (mask_a)) / float(mask_a);
				}
				else
				{
					TCU_FAIL("Internal error: invalid sampler type requested");
				}
			}
			else if (view_internalformat == GL_RGB10_A2UI)
			{
				unsigned int*	  reference_data = (unsigned int*)mipmap_texel_data;
				const unsigned int mask_rgb		  = (1 << 10) - 1;
				const unsigned int mask_a		  = (1 << 2) - 1;

				if (view_sampler_type == SAMPLER_TYPE_UNSIGNED_INTEGER)
				{
					reference_components_uint[0] = ((*reference_data)) & (mask_rgb);
					reference_components_uint[1] = ((*reference_data) >> 10) & (mask_rgb);
					reference_components_uint[2] = ((*reference_data) >> 20) & (mask_rgb);
					reference_components_uint[3] = ((*reference_data) >> 30) & (mask_a);
				}
				else
				{
					TCU_FAIL("Internal error: invalid sampler type requested");
				}
			}
			else if (view_internalformat == GL_RG16F)
			{
				unsigned short* reference_data = (unsigned short*)mipmap_texel_data;

				if (view_sampler_type == SAMPLER_TYPE_FLOAT)
				{
					reference_components_float[0] = tcu::Float16(*(reference_data + 0)).asFloat();
					reference_components_float[1] = tcu::Float16(*(reference_data + 1)).asFloat();
				}
				else
				{
					TCU_FAIL("Internal error: invalid sampler type requested");
				}
			}
			else
			{
				void* result_data = NULL;

				switch (view_sampler_type)
				{
				case SAMPLER_TYPE_FLOAT:
					result_data = reference_components_float;
					break;
				case SAMPLER_TYPE_SIGNED_INTEGER:
					result_data = reference_components_int;
					break;
				case SAMPLER_TYPE_UNSIGNED_INTEGER:
					result_data = reference_components_uint;
					break;

				default:
					TCU_FAIL("Unrecognized sampler type");
				}

				getComponentDataForByteAlignedInternalformat(mipmap_texel_data, n_view_components, view_component_sizes,
															 view_format, result_data);
			}

			for (unsigned int n_component = 0; n_component < n_view_components; ++n_component)
			{
				/* If view texture operates on sRGB color space, we need to adjust our
				 * reference value so that it is moved back into linear space.
				 */
				if (TextureViewUtilities::isInternalformatSRGB(view_internalformat) &&
					!TextureViewUtilities::isInternalformatSRGB(texture_internalformat))
				{
					DE_ASSERT(view_sampler_type == SAMPLER_TYPE_FLOAT);

					/* Convert as per (8.14) from GL4.4 spec. Exclude alpha channel. */
					if (n_component != 3)
					{
						if (reference_components_float[n_component] <= 0.04045f)
						{
							reference_components_float[n_component] /= 12.92f;
						}
						else
						{
							reference_components_float[n_component] =
								deFloatPow((reference_components_float[n_component] + 0.055f) / 1.055f, 2.4f);
						}
					} /* if (n_component != 3) */
				}	 /* if (TextureViewUtilities::isInternalformatSRGB(view_internalformat) ) */

				/* Compare the reference and view texture values */
				const float		   epsilon_float = 1.0f / float((1 << (view_component_sizes[n_component] - 1)) - 1);
				const signed int   epsilon_int   = 1;
				const unsigned int epsilon_uint  = 1;

				switch (view_sampler_type)
				{
				case SAMPLER_TYPE_FLOAT:
				{
					if (de::abs(reference_components_float[n_component] - view_components_float[n_component]) >
						epsilon_float)
					{
						has_failed = true;
					}

					break;
				}

				case SAMPLER_TYPE_SIGNED_INTEGER:
				{
					signed int larger_value  = 0;
					signed int smaller_value = 0;

					if (reference_components_int[n_component] > view_components_int[n_component])
					{
						larger_value  = reference_components_int[n_component];
						smaller_value = view_components_int[n_component];
					}
					else
					{
						smaller_value = reference_components_int[n_component];
						larger_value  = view_components_int[n_component];
					}

					if ((larger_value - smaller_value) > epsilon_int)
					{
						has_failed = true;
					}

					break;
				}

				case SAMPLER_TYPE_UNSIGNED_INTEGER:
				{
					unsigned int larger_value  = 0;
					unsigned int smaller_value = 0;

					if (reference_components_uint[n_component] > view_components_uint[n_component])
					{
						larger_value  = reference_components_uint[n_component];
						smaller_value = view_components_uint[n_component];
					}
					else
					{
						smaller_value = reference_components_uint[n_component];
						larger_value  = view_components_uint[n_component];
					}

					if ((larger_value - smaller_value) > epsilon_uint)
					{
						has_failed = true;
					}

					break;
				}

				default:
					TCU_FAIL("Unrecognized sampler type");
				} /* switch (view_sampler_type) */

				if (has_failed)
				{
					can_continue = false;

					switch (view_sampler_type)
					{
					case SAMPLER_TYPE_FLOAT:
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Invalid data sampled from a texture view "
																	   "["
										   << view_internalformat_string << "]"
																			" created from a texture object"
																			"["
										   << texture_internalformat_string << "]"
																			   " at texel "
																			   "("
										   << (n_texel % m_texture_width) << ", " << (n_texel / m_texture_height)
										   << "): expected:(" << reference_components_float[0] << ", "
										   << reference_components_float[1] << ", " << reference_components_float[2]
										   << ", " << reference_components_float[3] << ") found:("
										   << view_components_float[0] << ", " << view_components_float[1] << ", "
										   << view_components_float[2] << ", " << view_components_float[3] << ")."
										   << tcu::TestLog::EndMessage;

						break;
					}

					case SAMPLER_TYPE_SIGNED_INTEGER:
					{
						m_testCtx.getLog()
							<< tcu::TestLog::Message << "Invalid data sampled from a signed integer texture view "
														"["
							<< view_internalformat_string << "]"
															 " created from a texture object"
															 "["
							<< texture_internalformat_string << "]"
																" at texel "
																"("
							<< (n_texel % m_texture_width) << ", " << (n_texel / m_texture_height) << "): expected:("
							<< reference_components_int[0] << ", " << reference_components_int[1] << ", "
							<< reference_components_int[2] << ", " << reference_components_int[3] << ") found:("
							<< view_components_int[0] << ", " << view_components_int[1] << ", "
							<< view_components_int[2] << ", " << view_components_int[3] << ")."
							<< tcu::TestLog::EndMessage;

						break;
					}

					case SAMPLER_TYPE_UNSIGNED_INTEGER:
					{
						m_testCtx.getLog()
							<< tcu::TestLog::Message << "Invalid data sampled from an unsigned integer texture view "
														"["
							<< view_internalformat_string << "]"
															 " created from a texture object"
															 "["
							<< texture_internalformat_string << "]"
																" at texel "
																"("
							<< (n_texel % m_texture_width) << ", " << (n_texel / m_texture_height) << "): expected:("
							<< reference_components_uint[0] << ", " << reference_components_uint[1] << ", "
							<< reference_components_uint[2] << ", " << reference_components_uint[3] << ") found:("
							<< view_components_uint[0] << ", " << view_components_uint[1] << ", "
							<< view_components_uint[2] << ", " << view_components_uint[3] << ")."
							<< tcu::TestLog::EndMessage;

						break;
					}

					default:
						TCU_FAIL("Unrecognized sampler type");
					} /* switch (view_sampler_type) */

					break;
				} /* if (has_failed) */
			}	 /* for (all components) */
		}		  /* for (all texels) */
	}			  /* if (memcmp(texture_data_ptr, view_data_ptr, m_view_data_offset) != 0) */

	if (has_failed)
	{
		/* Log detailed information about the failure */
		m_testCtx.getLog() << tcu::TestLog::Message << "Invalid data read from a view of internalformat "
						   << "[" << view_internalformat_string << "]"
						   << " created from a texture of internalformat "
						   << "[" << texture_internalformat_string << "]"
						   << ". Byte streams follow:" << tcu::TestLog::EndMessage;

		/* Form texture and view data strings */
		std::stringstream mipmap_data_sstream;
		std::stringstream sampled_view_data_sstream;

		mipmap_data_sstream.fill('0');
		sampled_view_data_sstream.fill('0');

		mipmap_data_sstream.width(2);
		sampled_view_data_sstream.width(2);

		mipmap_data_sstream << "Mip-map data: [";
		sampled_view_data_sstream << "Sampled view data: [";

		for (unsigned int n = 0; n < m_view_data_offset; ++n)
		{
			mipmap_data_sstream << "0x" << std::hex << (int)(mipmap_data[n]);
			sampled_view_data_sstream << "0x" << std::hex << (int)(view_data_ptr[n]);

			if (n != (m_view_data_offset - 1))
			{
				mipmap_data_sstream << "|";
				sampled_view_data_sstream << "|";
			}
			else
			{
				mipmap_data_sstream << "]";
				sampled_view_data_sstream << "]";
			}
		}

		sampled_view_data_sstream << "\n";
		mipmap_data_sstream << "\n";

		/* Log both strings */
		m_testCtx.getLog() << tcu::TestLog::Message << mipmap_data_sstream.str() << sampled_view_data_sstream.str()
						   << tcu::TestLog::EndMessage;

		/* Do not fail the test at this point. Instead, raise a failure flag that will
		 * cause the test to fail once all iterations execute */
		m_has_test_failed = true;
	}
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Correct data read from a view of internalformat "
						   << "[" << view_internalformat_string << "]"
						   << " created from a texture of internalformat "
						   << "[" << texture_internalformat_string << "]" << tcu::TestLog::EndMessage;
	}
}